

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_12::ValidPolicyGraph::AddNode
          (ValidPolicyGraph *this,Input policy,
          vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *parent_policies)

{
  Input policy_00;
  Input lhs;
  bool bVar1;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_80;
  ValidPolicyGraph *local_68;
  uchar *puStack_60;
  Span<const_unsigned_char> local_58;
  Span<const_unsigned_char> local_48;
  ValidPolicyGraph *local_38;
  uchar *local_30;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *local_28;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *parent_policies_local;
  ValidPolicyGraph *this_local;
  Input policy_local;
  
  local_30 = (uchar *)policy.data_.size_;
  local_38 = (ValidPolicyGraph *)policy.data_.data_;
  local_28 = parent_policies;
  parent_policies_local = (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)this;
  this_local = local_38;
  policy_local.data_.data_ = local_30;
  Span<unsigned_char_const>::Span<4ul>
            ((Span<unsigned_char_const> *)&local_58,(uchar (*) [4])&kAnyPolicyOid);
  bssl::der::Input::Input((Input *)&local_48,local_58);
  lhs.data_.size_ = (size_t)local_30;
  lhs.data_.data_ = (uchar *)local_38;
  bVar1 = bssl::der::operator!=(lhs,(Input)local_48);
  if (!bVar1) {
    __assert_fail("policy != der::Input(kAnyPolicyOid)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                  ,0x294,
                  "void bssl::(anonymous namespace)::ValidPolicyGraph::AddNode(der::Input, std::vector<der::Input>)"
                 );
  }
  local_68 = this_local;
  puStack_60 = policy_local.data_.data_;
  ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::vector
            (&local_80,parent_policies);
  policy_00.data_.size_ = (size_t)puStack_60;
  policy_00.data_.data_ = (uchar *)local_68;
  AddNodeReturningIterator(this,policy_00,&local_80);
  ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~vector(&local_80);
  return;
}

Assistant:

void AddNode(der::Input policy, std::vector<der::Input> parent_policies) {
    assert(policy != der::Input(kAnyPolicyOid));
    AddNodeReturningIterator(policy, std::move(parent_policies));
  }